

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_mpt::llm_build_mpt
          (llm_build_mpt *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *this_00;
  pointer plVar2;
  ggml_context *pgVar3;
  uint32_t uVar4;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar5;
  ulong uVar6;
  undefined8 uVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *cur;
  long lVar11;
  int il;
  long lVar12;
  float __x;
  float fVar13;
  ggml_tensor *local_60;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  this_00 = (this->super_llm_graph_context).hparams;
  uVar1 = this_00->n_embd_head_v;
  uVar4 = llama_hparams::n_embd_v_gqa(this_00,0);
  if (uVar1 == ((this->super_llm_graph_context).hparams)->n_embd_head_k) {
    local_60 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
    inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
    if (model->pos_embd != (ggml_tensor *)0x0) {
      pgVar5 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      pgVar5 = (ggml_tensor *)
               ggml_get_rows((this->super_llm_graph_context).ctx0,model->pos_embd,pgVar5);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"pos_embd",-1);
      local_60 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,local_60,pgVar5);
      llm_graph_context::cb(&this->super_llm_graph_context,local_60,"inpL",-1);
    }
    if (0 < (this->super_llm_graph_context).n_layer) {
      __x = (float)uVar1;
      uVar6 = (ulong)uVar4;
      lVar11 = 0;
      lVar12 = 0;
      do {
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        il = (int)lVar12;
        pgVar5 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,local_60,
                            *(ggml_tensor **)((long)&plVar2->attn_norm + lVar11),
                            *(ggml_tensor **)((long)&plVar2->attn_norm_b + lVar11),LLM_NORM,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"attn_norm",il);
        pgVar5 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wqkv + lVar11),
                            pgVar5);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"wqkv",il);
        if (*(long *)((long)&((model->layers).
                              super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                              super__Vector_impl_data._M_start)->bqkv + lVar11) != 0) {
          pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"bqkv",il);
        }
        fVar13 = ((this->super_llm_graph_context).hparams)->f_clamp_kqv;
        if (0.0 < fVar13) {
          pgVar5 = (ggml_tensor *)ggml_clamp(-fVar13,(this->super_llm_graph_context).ctx0,pgVar5);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"wqkv_clamped",il);
        }
        pgVar3 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar3,pgVar5,(this->super_llm_graph_context).n_embd,
                             (long)(this->super_llm_graph_context).n_tokens,pgVar5->nb[1],0);
        pgVar8 = (ggml_tensor *)ggml_cont(pgVar3,uVar7);
        pgVar3 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar3,pgVar5,uVar6,(long)(this->super_llm_graph_context).n_tokens,
                             pgVar5->nb[1],(this->super_llm_graph_context).n_embd << 2);
        pgVar9 = (ggml_tensor *)ggml_cont(pgVar3,uVar7);
        pgVar3 = (this->super_llm_graph_context).ctx0;
        uVar7 = ggml_view_2d(pgVar3,pgVar5,uVar6,(long)(this->super_llm_graph_context).n_tokens,
                             pgVar5->nb[1],((this->super_llm_graph_context).n_embd + uVar6) * 4);
        pgVar10 = (ggml_tensor *)ggml_cont(pgVar3,uVar7);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Qcur",il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"Vcur",il);
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pgVar5 = *(ggml_tensor **)((long)&plVar2->attn_q_norm + lVar11);
        if (pgVar5 != (ggml_tensor *)0x0) {
          pgVar8 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,pgVar8,pgVar5,
                              *(ggml_tensor **)((long)&plVar2->attn_q_norm_b + lVar11),LLM_NORM,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Qcur",il);
          plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pgVar9 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,pgVar9,
                              *(ggml_tensor **)((long)&plVar2->attn_k_norm + lVar11),
                              *(ggml_tensor **)((long)&plVar2->attn_k_norm_b + lVar11),LLM_NORM,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
        }
        cur = (ggml_tensor *)
              ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar1,
                              (this->super_llm_graph_context).n_head,
                              (long)(this->super_llm_graph_context).n_tokens);
        pgVar9 = (ggml_tensor *)
                 ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar9,uVar1,
                                 (this->super_llm_graph_context).n_head_kv,
                                 (long)(this->super_llm_graph_context).n_tokens);
        pgVar10 = (ggml_tensor *)
                  ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar10,uVar1,
                                  (this->super_llm_graph_context).n_head_kv,
                                  (long)(this->super_llm_graph_context).n_tokens);
        llm_graph_context::cb(&this->super_llm_graph_context,cur,"Qcur",il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Kcur",il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"Vcur",il);
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pgVar5 = *(ggml_tensor **)((long)&plVar2->wo + lVar11);
        pgVar8 = *(ggml_tensor **)((long)&plVar2->bo + lVar11);
        fVar13 = SQRT(__x);
        if (__x < 0.0) {
          fVar13 = sqrtf(__x);
        }
        pgVar5 = llm_graph_context::build_attn
                           (&this->super_llm_graph_context,inp,gf,pgVar5,pgVar8,cur,pgVar9,pgVar10,
                            (ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / fVar13,il);
        if (lVar12 == (this->super_llm_graph_context).n_layer + -1) {
          pgVar8 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
          pgVar5 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar5,pgVar8);
          local_60 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,local_60,pgVar8);
        }
        pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,local_60);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_inp",il);
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pgVar8 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,pgVar5,
                            *(ggml_tensor **)((long)&plVar2->ffn_norm + lVar11),
                            *(ggml_tensor **)((long)&plVar2->ffn_norm_b + lVar11),LLM_NORM,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_norm",il);
        plVar2 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pgVar8 = llm_graph_context::build_ffn
                           (&this->super_llm_graph_context,pgVar8,
                            *(ggml_tensor **)((long)&plVar2->ffn_up + lVar11),
                            *(ggml_tensor **)((long)&plVar2->ffn_up_b + lVar11),(ggml_tensor *)0x0,
                            (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                            *(ggml_tensor **)((long)&plVar2->ffn_down + lVar11),
                            *(ggml_tensor **)((long)&plVar2->ffn_down_b + lVar11),(ggml_tensor *)0x0
                            ,*(ggml_tensor **)((long)&plVar2->ffn_act + lVar11),LLM_FFN_GELU,
                            LLM_FFN_SEQ,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_out",il);
        pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,pgVar5);
        local_60 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar5,il);
        llm_graph_context::cb(&this->super_llm_graph_context,local_60,"l_out",il);
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x4f0;
      } while (lVar12 < (this->super_llm_graph_context).n_layer);
    }
    pgVar5 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,local_60,model->output_norm,
                        model->output_norm_b,LLM_NORM,-1);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_norm",-1);
    ((this->super_llm_graph_context).res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar5;
    pgVar5 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar5);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_output",-1);
    ((this->super_llm_graph_context).res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar5;
    ggml_build_forward_expand(gf,pgVar5);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x1733,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
}

Assistant:

llm_build_mpt(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * pos;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        auto * inp_attn = build_attn_inp_kv_unified();

        if (model.pos_embd) {
            // inp_pos - contains the positions
            ggml_tensor * inp_pos = build_inp_pos();
            pos = ggml_get_rows(ctx0, model.pos_embd, inp_pos);
            cb(pos, "pos_embd", -1);

            inpL = ggml_add(ctx0, inpL, pos);
            cb(inpL, "inpL", -1);
        }

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * attn_norm;

            attn_norm = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(attn_norm, "attn_norm", il);

            // self-attention
            {
                cur = attn_norm;

                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                if (model.layers[il].bqkv){
                    cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                    cb(cur, "bqkv", il);
                }

                if (hparams.f_clamp_kqv > 0.0f) {
                    cur = ggml_clamp(ctx0, cur, -hparams.f_clamp_kqv, hparams.f_clamp_kqv);
                    cb(cur, "wqkv_clamped", il);
                }

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                // Q/K Layernorm
                if (model.layers[il].attn_q_norm) {
                    Qcur = build_norm(Qcur,
                            model.layers[il].attn_q_norm,
                            model.layers[il].attn_q_norm_b,
                            LLM_NORM, il);
                    cb(Qcur, "Qcur", il);

                    Kcur = build_norm(Kcur,
                            model.layers[il].attn_k_norm,
                            model.layers[il].attn_k_norm_b,
                            LLM_NORM, il);
                    cb(Kcur, "Kcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // Add the input
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            // feed forward
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        model.layers[il].ffn_act,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }